

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O1

void __thiscall wasm::SourceMapReader::parse(SourceMapReader *this,Module *wasm)

{
  char **ppcVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  vector<char,_std::allocator<char>_> *pvVar3;
  Value *pVVar4;
  pointer pRVar5;
  int *piVar6;
  element_type *peVar7;
  char *pcVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__s;
  SourceMapReader *pSVar9;
  bool bVar10;
  int32_t iVar11;
  Ref *pRVar12;
  size_t sVar13;
  void *__ptr;
  size_t sVar14;
  string *psVar15;
  undefined1 reuse;
  char reuse_00;
  pointer pcVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var17;
  ulong uVar18;
  int *piVar19;
  undefined *puVar20;
  char *pcVar21;
  ulong uVar22;
  string *psVar23;
  string_view sVar24;
  undefined1 *local_1f0;
  long local_1e8;
  undefined1 local_1e0 [16];
  undefined1 *local_1d0;
  long local_1c8;
  undefined1 local_1c0 [16];
  undefined1 *local_1b0;
  long local_1a8;
  undefined1 local_1a0 [16];
  undefined1 *local_190;
  long local_188;
  undefined1 local_180 [16];
  undefined1 *local_170;
  long local_168;
  undefined1 local_160 [16];
  undefined1 *local_150;
  long local_148;
  undefined1 local_140 [16];
  undefined1 *local_130;
  long local_128;
  undefined1 local_120 [16];
  undefined1 *local_110;
  long local_108;
  undefined1 local_100 [16];
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  SourceMapReader *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  Module *local_80;
  undefined1 local_78 [8];
  Value json;
  JsonParseException jx;
  allocator<char> local_31;
  
  pvVar3 = this->buffer;
  pcVar16 = (pvVar3->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pcVar16 ==
      (pvVar3->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    return;
  }
  local_78._0_4_ = Null;
  json.type = String;
  json._4_4_ = 0;
  local_80 = wasm;
  ::json::Value::parse
            ((Value *)local_78,
             (pvVar3->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start,ASCII);
  reuse = SUB81(pcVar16,0);
  if (local_78._0_4_ != Object) {
    psVar15 = (string *)__cxa_allocate_exception(0x20);
    local_1f0 = local_1e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f0,"Source map is not valid JSON","");
    *(string **)psVar15 = psVar15 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar15,local_1f0,local_1f0 + local_1e8);
    __cxa_throw(psVar15,&MapParseException::typeinfo,MapParseException::~MapParseException);
  }
  sVar24 = IString::interned((IString *)0x7,(string_view)ZEXT816(0xe4f0a7),(bool)reuse);
  bVar10 = ::json::Value::has((Value *)local_78,(IString)sVar24);
  if (bVar10) {
    sVar24 = IString::interned((IString *)0x7,(string_view)ZEXT816(0xe4f0a7),(bool)reuse);
    pRVar12 = ::json::Value::operator[]((Value *)local_78,(IString)sVar24);
    if (((pRVar12->super_shared_ptr<json::Value>).
         super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type == Number) {
      sVar24 = IString::interned((IString *)0x7,(string_view)ZEXT816(0xe4f0a7),(bool)reuse);
      pRVar12 = ::json::Value::operator[]((Value *)local_78,(IString)sVar24);
      iVar11 = ::json::Value::getInteger
                         ((pRVar12->super_shared_ptr<json::Value>).
                          super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if (iVar11 == 3) {
        sVar24 = IString::interned((IString *)0x7,(string_view)ZEXT816(0xe4bd7f),(bool)reuse);
        bVar10 = ::json::Value::has((Value *)local_78,(IString)sVar24);
        if (bVar10) {
          sVar24 = IString::interned((IString *)0x7,(string_view)ZEXT816(0xe4bd7f),(bool)reuse);
          pRVar12 = ::json::Value::operator[]((Value *)local_78,(IString)sVar24);
          if (((pRVar12->super_shared_ptr<json::Value>).
               super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type == Array) {
            sVar24 = IString::interned((IString *)0x7,(string_view)ZEXT816(0xe4bd7f),(bool)reuse);
            pRVar12 = ::json::Value::operator[]((Value *)local_78,(IString)sVar24);
            pVVar4 = (pRVar12->super_shared_ptr<json::Value>).
                     super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var17 = (pRVar12->super_shared_ptr<json::Value>).
                      super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
              }
            }
            local_90 = this;
            local_88 = p_Var17;
            sVar13 = ::json::Value::size(pVVar4);
            reuse_00 = (char)p_Var17;
            if (sVar13 != 0) {
              pvVar2 = &local_80->debugInfoFileNames;
              uVar22 = 0;
              ppcVar1 = &json.field_1.str.str._M_str;
              do {
                if (pVVar4->type != Array) goto LAB_00c659f9;
                uVar18 = uVar22 & 0xffffffff;
                pRVar5 = (((pVVar4->field_1).arr)->
                         super__Vector_base<json::Value::Ref,_std::allocator<json::Value::Ref>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                piVar6 = (int *)pRVar5[uVar18].super_shared_ptr<json::Value>.
                                super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                p_Var17 = pRVar5[uVar18].super_shared_ptr<json::Value>.
                          super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi;
                if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                  }
                }
                if (pVVar4->type != Array) goto LAB_00c659f9;
                piVar19 = (int *)(((pVVar4->field_1).arr)->
                                 super__Vector_base<json::Value::Ref,_std::allocator<json::Value::Ref>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar18].
                                 super_shared_ptr<json::Value>.
                                 super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                if (*piVar19 != 0) {
                  psVar15 = (string *)__cxa_allocate_exception(0x20);
                  local_190 = local_180;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_190,"Source map sources contains non-string","");
                  *(string **)psVar15 = psVar15 + 0x10;
                  std::__cxx11::string::_M_construct<char*>(psVar15,local_190,local_190 + local_188)
                  ;
                  __cxa_throw(psVar15,&MapParseException::typeinfo,
                              MapParseException::~MapParseException);
                }
                if (*piVar6 != 0) goto LAB_00c65a18;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)ppcVar1,*(char **)(piVar6 + 4),&local_31);
                reuse_00 = (char)piVar19;
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           pvVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)ppcVar1);
                if (json.field_1._8_8_ != &jx.errorText._M_string_length) {
                  operator_delete(json.field_1.str.str._M_str,jx.errorText._M_string_length + 1);
                }
                if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
                }
                uVar22 = uVar22 + 1;
                sVar13 = ::json::Value::size(pVVar4);
              } while (uVar22 < sVar13);
            }
            sVar24 = IString::interned((IString *)0xe,(string_view)ZEXT816(0xe4bdd9),(bool)reuse_00)
            ;
            bVar10 = ::json::Value::has((Value *)local_78,(IString)sVar24);
            if (bVar10) {
              sVar24 = IString::interned((IString *)0xe,(string_view)ZEXT816(0xe4bdd9),
                                         (bool)reuse_00);
              pRVar12 = ::json::Value::operator[]((Value *)local_78,(IString)sVar24);
              pVVar4 = (pRVar12->super_shared_ptr<json::Value>).
                       super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              p_Var17 = (pRVar12->super_shared_ptr<json::Value>).
                        super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi;
              if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                }
              }
              jx.errorText.field_2._8_8_ = p_Var17;
              if (pVVar4->type != Array) {
                psVar15 = (string *)__cxa_allocate_exception(0x20);
                local_170 = local_160;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_170,"Source map sourcesContent is not an array","");
                *(string **)psVar15 = psVar15 + 0x10;
                std::__cxx11::string::_M_construct<char*>(psVar15,local_170,local_170 + local_168);
                __cxa_throw(psVar15,&MapParseException::typeinfo,
                            MapParseException::~MapParseException);
              }
              sVar13 = ::json::Value::size(pVVar4);
              reuse_00 = (char)p_Var17;
              if (sVar13 != 0) {
                pvVar2 = &local_80->debugInfoSourcesContent;
                uVar22 = 0;
                ppcVar1 = &json.field_1.str.str._M_str;
                do {
                  if (pVVar4->type != Array) goto LAB_00c659f9;
                  reuse_00 = (char)(uVar22 & 0xffffffff) * '\x10';
                  piVar6 = (int *)(((pVVar4->field_1).arr)->
                                  super__Vector_base<json::Value::Ref,_std::allocator<json::Value::Ref>_>
                                  )._M_impl.super__Vector_impl_data._M_start[uVar22 & 0xffffffff].
                                  super_shared_ptr<json::Value>.
                                  super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  ;
                  if (*piVar6 != 0) goto LAB_00c65a18;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)ppcVar1,*(char **)(piVar6 + 4),&local_31);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             pvVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)ppcVar1);
                  if (json.field_1._8_8_ != &jx.errorText._M_string_length) {
                    operator_delete(json.field_1.str.str._M_str,jx.errorText._M_string_length + 1);
                  }
                  uVar22 = uVar22 + 1;
                  sVar13 = ::json::Value::size(pVVar4);
                } while (uVar22 < sVar13);
              }
              if (jx.errorText.field_2._8_8_ != 0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           jx.errorText.field_2._8_8_);
              }
            }
            sVar24 = IString::interned((IString *)0x5,(string_view)ZEXT816(0xddee9f),(bool)reuse_00)
            ;
            bVar10 = ::json::Value::has((Value *)local_78,(IString)sVar24);
            if (bVar10) {
              sVar24 = IString::interned((IString *)0x5,(string_view)ZEXT816(0xddee9f),
                                         (bool)reuse_00);
              pRVar12 = ::json::Value::operator[]((Value *)local_78,(IString)sVar24);
              pVVar4 = (pRVar12->super_shared_ptr<json::Value>).
                       super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              p_Var17 = (pRVar12->super_shared_ptr<json::Value>).
                        super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi;
              if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                }
              }
              jx.errorText.field_2._8_8_ = p_Var17;
              if (pVVar4->type != Array) {
                psVar15 = (string *)__cxa_allocate_exception(0x20);
                local_150 = local_140;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_150,"Source map names is not an array","");
                *(string **)psVar15 = psVar15 + 0x10;
                std::__cxx11::string::_M_construct<char*>(psVar15,local_150,local_150 + local_148);
                __cxa_throw(psVar15,&MapParseException::typeinfo,
                            MapParseException::~MapParseException);
              }
              sVar13 = ::json::Value::size(pVVar4);
              reuse_00 = (char)p_Var17;
              if (sVar13 != 0) {
                pvVar2 = &local_80->debugInfoSymbolNames;
                uVar22 = 0;
                ppcVar1 = &json.field_1.str.str._M_str;
                do {
                  if (pVVar4->type != Array) {
LAB_00c659f9:
                    __assert_fail("isArray()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/json.h"
                                  ,0x197,"Ref &json::Value::operator[](unsigned int)");
                  }
                  pRVar5 = (((pVVar4->field_1).arr)->
                           super__Vector_base<json::Value::Ref,_std::allocator<json::Value::Ref>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  puVar20 = (undefined *)((uVar22 & 0xffffffff) * 0x10);
                  piVar6 = *(int **)(puVar20 + (long)pRVar5);
                  p_Var17 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                             (puVar20 +
                             (long)&(pRVar5->super_shared_ptr<json::Value>).
                                    super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
                  if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    puVar20 = &__libc_single_threaded;
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                    }
                  }
                  reuse_00 = (char)puVar20;
                  if (*piVar6 != 0) {
                    psVar15 = (string *)__cxa_allocate_exception(0x20);
                    local_130 = local_120;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_130,"Source map names contains non-string","");
                    *(string **)psVar15 = psVar15 + 0x10;
                    std::__cxx11::string::_M_construct<char*>
                              (psVar15,local_130,local_130 + local_128);
                    __cxa_throw(psVar15,&MapParseException::typeinfo,
                                MapParseException::~MapParseException);
                  }
                  if (*piVar6 != 0) {
LAB_00c65a18:
                    __assert_fail("isString()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/json.h"
                                  ,0xbe,"const char *json::Value::getCString()");
                  }
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)ppcVar1,*(char **)(piVar6 + 4),&local_31);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             pvVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)ppcVar1);
                  if (json.field_1._8_8_ != &jx.errorText._M_string_length) {
                    operator_delete(json.field_1.str.str._M_str,jx.errorText._M_string_length + 1);
                  }
                  if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
                  }
                  uVar22 = uVar22 + 1;
                  sVar13 = ::json::Value::size(pVVar4);
                } while (uVar22 < sVar13);
              }
              if (jx.errorText.field_2._8_8_ != 0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           jx.errorText.field_2._8_8_);
              }
            }
            sVar24 = IString::interned((IString *)0xa,(string_view)ZEXT816(0xe4be58),(bool)reuse_00)
            ;
            bVar10 = ::json::Value::has((Value *)local_78,(IString)sVar24);
            if (bVar10) {
              sVar24 = IString::interned((IString *)0xa,(string_view)ZEXT816(0xe4be58),
                                         (bool)reuse_00);
              pRVar12 = ::json::Value::operator[]((Value *)local_78,(IString)sVar24);
              peVar7 = (pRVar12->super_shared_ptr<json::Value>).
                       super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              p_Var17 = (pRVar12->super_shared_ptr<json::Value>).
                        super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi;
              if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                }
              }
              if (peVar7->type != String) {
                psVar15 = (string *)__cxa_allocate_exception(0x20);
                local_110 = local_100;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_110,"Source map sourceRoot is not a string","");
                *(string **)psVar15 = psVar15 + 0x10;
                std::__cxx11::string::_M_construct<char*>(psVar15,local_110,local_110 + local_108);
                __cxa_throw(psVar15,&MapParseException::typeinfo,
                            MapParseException::~MapParseException);
              }
              pcVar21 = (peVar7->field_1).str.str._M_str;
              psVar23 = &local_80->debugInfoSourceRoot;
              pcVar8 = (char *)(local_80->debugInfoSourceRoot)._M_string_length;
              strlen(pcVar21);
              std::__cxx11::string::_M_replace((ulong)psVar23,0,pcVar8,(ulong)pcVar21);
              reuse_00 = (char)pcVar21;
              if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
              }
            }
            sVar24 = IString::interned((IString *)0x4,(string_view)ZEXT816(0xe73978),(bool)reuse_00)
            ;
            bVar10 = ::json::Value::has((Value *)local_78,(IString)sVar24);
            if (bVar10) {
              sVar24 = IString::interned((IString *)0x4,(string_view)ZEXT816(0xe73978),
                                         (bool)reuse_00);
              pRVar12 = ::json::Value::operator[]((Value *)local_78,(IString)sVar24);
              peVar7 = (pRVar12->super_shared_ptr<json::Value>).
                       super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              p_Var17 = (pRVar12->super_shared_ptr<json::Value>).
                        super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi;
              if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                }
              }
              if (peVar7->type != String) {
                psVar15 = (string *)__cxa_allocate_exception(0x20);
                local_f0 = local_e0;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_f0,"Source map file is not a string","");
                *(string **)psVar15 = psVar15 + 0x10;
                std::__cxx11::string::_M_construct<char*>(psVar15,local_f0,local_f0 + local_e8);
                __cxa_throw(psVar15,&MapParseException::typeinfo,
                            MapParseException::~MapParseException);
              }
              pcVar21 = (peVar7->field_1).str.str._M_str;
              pcVar8 = (char *)(local_80->debugInfoFile)._M_string_length;
              psVar23 = &local_80->debugInfoFile;
              strlen(pcVar21);
              std::__cxx11::string::_M_replace((ulong)psVar23,0,pcVar8,(ulong)pcVar21);
              reuse_00 = (char)pcVar21;
              if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
              }
            }
            sVar24 = IString::interned((IString *)&DAT_00000008,(string_view)ZEXT816(0xe4bea9),
                                       (bool)reuse_00);
            bVar10 = ::json::Value::has((Value *)local_78,(IString)sVar24);
            if (!bVar10) {
              psVar15 = (string *)__cxa_allocate_exception(0x20);
              local_d0 = local_c0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d0,"Source map mappings missing","");
              *(string **)psVar15 = psVar15 + 0x10;
              std::__cxx11::string::_M_construct<char*>(psVar15,local_d0,local_d0 + local_c8);
              __cxa_throw(psVar15,&MapParseException::typeinfo,MapParseException::~MapParseException
                         );
            }
            sVar24 = IString::interned((IString *)&DAT_00000008,(string_view)ZEXT816(0xe4bea9),
                                       (bool)reuse_00);
            __ptr = (void *)sVar24._M_len;
            pRVar12 = ::json::Value::operator[]((Value *)local_78,(IString)sVar24);
            peVar7 = (pRVar12->super_shared_ptr<json::Value>).
                     super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var17 = (pRVar12->super_shared_ptr<json::Value>).
                      super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
              }
            }
            if (peVar7->type == String) {
              __s = (peVar7->field_1).ref.super_shared_ptr<json::Value>.
                    super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
              sVar14 = strlen((char *)__s);
              pSVar9 = local_90;
              (local_90->mappings)._M_len = sVar14;
              (local_90->mappings)._M_str = (char *)__s;
              if (sVar14 == 0) {
                sVar13 = 0;
              }
              else {
                iVar11 = readBase64VLQ(local_90);
                sVar13 = (size_t)iVar11;
              }
              pSVar9->location = sVar13;
              if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
              }
              if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
              }
              ::json::Value::free((Value *)local_78,__ptr);
              return;
            }
            psVar15 = (string *)__cxa_allocate_exception(0x20);
            local_b0 = local_a0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b0,"Source map mappings is not a string","");
            *(string **)psVar15 = psVar15 + 0x10;
            std::__cxx11::string::_M_construct<char*>(psVar15,local_b0,local_b0 + local_a8);
            __cxa_throw(psVar15,&MapParseException::typeinfo,MapParseException::~MapParseException);
          }
        }
        psVar15 = (string *)__cxa_allocate_exception(0x20);
        local_1b0 = local_1a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1b0,"Source map sources missing or not an array","");
        *(string **)psVar15 = psVar15 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar15,local_1b0,local_1b0 + local_1a8);
        __cxa_throw(psVar15,&MapParseException::typeinfo,MapParseException::~MapParseException);
      }
    }
  }
  psVar15 = (string *)__cxa_allocate_exception(0x20);
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d0,"Source map version missing or is not 3","");
  *(string **)psVar15 = psVar15 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar15,local_1d0,local_1d0 + local_1c8);
  __cxa_throw(psVar15,&MapParseException::typeinfo,MapParseException::~MapParseException);
}

Assistant:

void SourceMapReader::parse(Module& wasm) {
  if (buffer.empty()) {
    return;
  }
  json::Value json;
  try {
    json.parse(buffer.data(), json::Value::ASCII);
  } catch (json::JsonParseException jx) {
    throw MapParseException(jx);
  }
  if (!json.isObject()) {
    throw MapParseException("Source map is not valid JSON");
  }
  if (!(json.has("version") && json["version"]->isNumber() &&
        json["version"]->getInteger() == 3)) {
    throw MapParseException("Source map version missing or is not 3");
  }
  if (!(json.has("sources") && json["sources"]->isArray())) {
    throw MapParseException("Source map sources missing or not an array");
  }
  json::Ref s = json["sources"];
  for (size_t i = 0; i < s->size(); i++) {
    json::Ref v = s[i];
    if (!(s[i]->isString())) {
      throw MapParseException("Source map sources contains non-string");
    }
    wasm.debugInfoFileNames.push_back(v->getCString());
  }

  if (json.has("sourcesContent")) {
    json::Ref sc = json["sourcesContent"];
    if (!sc->isArray()) {
      throw MapParseException("Source map sourcesContent is not an array");
    }
    for (size_t i = 0; i < sc->size(); i++) {
      wasm.debugInfoSourcesContent.push_back(sc[i]->getCString());
    }
  }

  if (json.has("names")) {
    json::Ref n = json["names"];
    if (!n->isArray()) {
      throw MapParseException("Source map names is not an array");
    }
    for (size_t i = 0; i < n->size(); i++) {
      json::Ref v = n[i];
      if (!v->isString()) {
        throw MapParseException("Source map names contains non-string");
      }
      wasm.debugInfoSymbolNames.push_back(v->getCString());
    }
  }

  if (json.has("sourceRoot")) {
    json::Ref sr = json["sourceRoot"];
    if (!sr->isString()) {
      throw MapParseException("Source map sourceRoot is not a string");
    }
    wasm.debugInfoSourceRoot = sr->getCString();
  }

  if (json.has("file")) {
    json::Ref f = json["file"];
    if (!f->isString()) {
      throw MapParseException("Source map file is not a string");
    }
    wasm.debugInfoFile = f->getCString();
  }

  if (!json.has("mappings")) {
    throw MapParseException("Source map mappings missing");
  }
  json::Ref m = json["mappings"];
  if (!m->isString()) {
    throw MapParseException("Source map mappings is not a string");
  }

  mappings = m->getCString();
  if (mappings.empty()) {
    // There are no mappings.
    location = 0;
    return;
  }

  // Read the location of the first debug location.
  location = readBase64VLQ();
}